

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O1

bdecode_node * __thiscall
libtorrent::bdecode_node::dict_find
          (bdecode_node *__return_storage_ptr__,bdecode_node *this,string_view key)

{
  bdecode_token *tokens;
  char *buf;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  
  tokens = this->m_root_tokens;
  iVar7 = this->m_token_idx + 1;
  do {
    uVar4 = SUB84(tokens[iVar7],0);
    uVar3 = uVar4 & 0xe0000000;
    if (uVar3 == 0xc0000000) {
      __return_storage_ptr__->m_last_index = 0;
      __return_storage_ptr__->m_last_token = 0;
      __return_storage_ptr__->m_size = 0;
      *(undefined4 *)&__return_storage_ptr__->field_0x3c = 0;
      __return_storage_ptr__->m_buffer = (char *)0x0;
      __return_storage_ptr__->m_buffer_size = 0;
      __return_storage_ptr__->m_token_idx = 0;
      *(undefined1 (*) [16])
       &(__return_storage_ptr__->m_tokens).
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      (__return_storage_ptr__->m_tokens).
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->m_tokens).
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __return_storage_ptr__->m_token_idx = -1;
      __return_storage_ptr__->m_last_index = -1;
      __return_storage_ptr__->m_last_token = -1;
      __return_storage_ptr__->m_size = -1;
      return __return_storage_ptr__;
    }
    uVar1 = SUB84(tokens[iVar7],4);
    uVar6 = (uVar1 >> 0x1d) + (uint)(uVar3 != 0x60000000) * 8 + (uVar4 & 0x1fffffff) + 2;
    iVar5 = (*(uint *)(tokens + (long)iVar7 + 1) & 0x1fffffff) - uVar6;
    if ((iVar5 == (int)key._M_len) &&
       ((buf = this->m_buffer, (*(uint *)(tokens + (long)iVar7 + 1) & 0x1fffffff) == uVar6 ||
        (iVar5 = bcmp(key._M_str,
                      buf + (ulong)((uVar1 >> 0x1d) + (uint)(uVar3 != 0x60000000) * 8 + 2) +
                            (ulong)(uVar4 & 0x1fffffff),(long)iVar5), iVar5 == 0)))) {
      iVar7 = (uVar1 & 0x1fffffff) + iVar7;
      bdecode_node(__return_storage_ptr__,tokens,buf,this->m_buffer_size,iVar7);
      bVar2 = false;
    }
    else {
      iVar7 = (uVar1 & 0x1fffffff) + iVar7;
      iVar7 = iVar7 + (*(uint *)&tokens[iVar7].field_0x4 & 0x1fffffff);
      bVar2 = true;
    }
  } while (bVar2);
  return __return_storage_ptr__;
}

Assistant:

bdecode_node bdecode_node::dict_find(string_view key) const
	{
		TORRENT_ASSERT(type() == dict_t);

		bdecode_token const* const tokens = m_root_tokens;

		// this is the first item
		int token = m_token_idx + 1;

		while (tokens[token].type != bdecode_token::end)
		{
			bdecode_token const& t = tokens[token];
			TORRENT_ASSERT(t.type == bdecode_token::string
				|| t.type == bdecode_token::long_string);
			int const size = token_source_span(t) - t.start_offset();
			if (int(key.size()) == size
				&& std::equal(key.data(), key.data() + size, m_buffer
					+ t.offset + t.start_offset()))
			{
				// skip key
				token += t.next_item;
				TORRENT_ASSERT(tokens[token].type != bdecode_token::end);

				return bdecode_node(tokens, m_buffer, m_buffer_size, token);
			}

			// skip key
			token += t.next_item;
			TORRENT_ASSERT(tokens[token].type != bdecode_token::end);

			// skip value
			token += tokens[token].next_item;
		}

		return bdecode_node();
	}